

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

void container_add_offset_test(void **state_)

{
  long lVar1;
  ushort *puVar2;
  char *pcVar3;
  long *in_RDI;
  size_t i;
  int card_hi;
  int card_lo;
  uint8_t type;
  uint16_t offset;
  container_add_offset_test_case_t test;
  container_add_offset_test_state_t *state;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  uint8_t in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  char *in_stack_ffffffffffffffb8;
  char *expression;
  uint in_stack_ffffffffffffffc0;
  int iVar5;
  int iVar6;
  undefined1 in_stack_ffffffffffffffcc;
  ushort local_18;
  undefined1 uStack_16;
  
  lVar1 = *in_RDI;
  puVar2 = *(ushort **)(lVar1 + 8);
  pcVar3 = *(char **)(lVar1 + 0x10);
  local_18 = (ushort)*(undefined8 *)(lVar1 + 0x18);
  uStack_16 = (undefined1)((ulong)*(undefined8 *)(lVar1 + 0x18) >> 0x10);
  iVar6 = 0;
  iVar5 = 0;
  _assert_true((ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  container_add_offset
            ((container_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
             (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
             (container_t **)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (container_t **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  container_add_offset
            ((container_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
             (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
             (container_t **)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (container_t **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  container_add_offset
            ((container_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
             (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
             (container_t **)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (container_t **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  if ((uint)local_18 + (uint)*puVar2 < 0x10000) {
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    container_equals((container_t *)
                     CONCAT26(local_18,CONCAT15(uStack_16,CONCAT14(in_stack_ffffffffffffffcc,iVar6))
                             ),(uint8_t)((uint)iVar5 >> 0x18),in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb7);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    iVar6 = container_get_cardinality
                      ((container_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       '\0');
  }
  else {
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  if ((uint)local_18 + (uint)puVar2[(long)(pcVar3 + -1)] < 0x10000) {
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  }
  else {
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    container_equals((container_t *)
                     CONCAT26(local_18,CONCAT15(uStack_16,CONCAT14(in_stack_ffffffffffffffcc,iVar6))
                             ),(uint8_t)((uint)iVar5 >> 0x18),in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb7);
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                 (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    iVar5 = container_get_cardinality
                      ((container_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       '\0');
  }
  _assert_int_equal(CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                    (unsigned_long)in_stack_ffffffffffffffb8,
                    (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
  expression = (char *)0x0;
  while( true ) {
    uVar4 = false;
    if (expression < pcVar3) {
      uVar4 = (uint)local_18 + (uint)puVar2[(long)expression] < 0x10000;
    }
    if ((bool)uVar4 == false) break;
    container_contains((container_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       0,'\0');
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),expression,
                 (char *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
    expression = expression + 1;
  }
  uVar4 = 0;
  for (; expression < pcVar3; expression = expression + 1) {
    container_contains((container_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       0,'\0');
    _assert_true(CONCAT44(iVar5,in_stack_ffffffffffffffc0),expression,
                 (char *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

static void container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    uint16_t offset = test.offset;
    uint8_t type = test.type;
    int card_lo = 0, card_hi = 0;

    assert_true(test.n_values > 0);

    container_add_offset(state->in, type, &state->lo, &state->hi, offset);
    container_add_offset(state->in, type, NULL, &state->hi_only, offset);
    container_add_offset(state->in, type, &state->lo_only, NULL, offset);

    if ((int)offset + test.values[0] > UINT16_MAX) {
        assert_null(state->lo);
        assert_null(state->lo_only);
    } else {
        assert_non_null(state->lo);
        assert_non_null(state->lo_only);
        assert_true(container_equals(state->lo, type, state->lo_only, type));
        card_lo = container_get_cardinality(state->lo, type);
    }
    if ((int)offset + test.values[test.n_values - 1] <= UINT16_MAX) {
        assert_null(state->hi);
        assert_null(state->hi_only);
    } else {
        assert_non_null(state->hi);
        assert_non_null(state->hi_only);
        assert_true(container_equals(state->hi, type, state->hi_only, type));
        card_hi = container_get_cardinality(state->hi, type);
    }

    assert_int_equal(test.n_values, card_lo + card_hi);

    size_t i = 0;
    for (; i < test.n_values && (int)offset + test.values[i] <= UINT16_MAX;
         i++) {
        assert_true(
            container_contains(state->lo, offset + test.values[i], type));
    }
    for (; i < test.n_values; i++) {
        assert_true(
            container_contains(state->hi, offset + test.values[i], type));
    }
}